

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O1

void av1_get_nz_map_contexts_sse2
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  byte *pbVar1;
  int8_t *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  short sVar13;
  int iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  int iVar38;
  uint uVar39;
  undefined6 in_register_00000012;
  int col;
  int iVar40;
  int iVar41;
  uint8_t *puVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  int stride;
  int8_t *piVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  char cVar85;
  char cVar86;
  char cVar87;
  char cVar88;
  char cVar89;
  char cVar90;
  char cVar91;
  char cVar92;
  char cVar93;
  char cVar94;
  char cVar95;
  char cVar96;
  char cVar97;
  char cVar98;
  char cVar99;
  char cVar100;
  char cVar101;
  char cVar102;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar106;
  char cVar107;
  char cVar108;
  char cVar109;
  char cVar110;
  char cVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  byte bVar132;
  byte bVar133;
  byte bVar134;
  byte bVar135;
  byte bVar136;
  byte bVar137;
  byte bVar138;
  byte bVar139;
  byte bVar140;
  byte bVar141;
  byte bVar142;
  byte bVar143;
  byte bVar144;
  byte bVar145;
  byte bVar146;
  byte bVar147;
  byte bVar148;
  byte bVar149;
  byte bVar150;
  byte bVar151;
  byte bVar152;
  byte bVar153;
  byte bVar154;
  byte bVar155;
  byte bVar156;
  byte bVar157;
  byte bVar158;
  byte bVar159;
  byte bVar160;
  byte bVar161;
  byte bVar162;
  byte bVar163;
  byte bVar164;
  byte bVar165;
  byte bVar166;
  byte bVar167;
  byte bVar168;
  byte bVar169;
  byte bVar170;
  byte bVar171;
  byte bVar172;
  byte bVar173;
  byte bVar174;
  byte bVar175;
  byte bVar176;
  byte bVar177;
  byte bVar178;
  byte bVar179;
  byte bVar180;
  byte bVar181;
  byte bVar182;
  byte bVar183;
  byte bVar184;
  byte bVar185;
  byte bVar186;
  byte bVar187;
  byte bVar188;
  byte bVar189;
  byte bVar190;
  byte bVar191;
  
  iVar38 = (int)CONCAT62(in_register_00000012,eob) + -1;
  if (iVar38 == 0) {
    *coeff_contexts = '\0';
    return;
  }
  uVar48 = (ulong)tx_size;
  if (tx_size < 0x11) {
    uVar36 = 3;
    if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_0025591a:
      uVar36 = uVar48;
    }
  }
  else if (tx_size == '\x11') {
    uVar36 = 9;
  }
  else {
    if (tx_size != '\x12') goto LAB_0025591a;
    uVar36 = 10;
  }
  iVar14 = tx_size_wide[uVar36];
  if (tx_size < 0x11) {
    uVar35 = 3;
    if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_00255963:
      uVar35 = uVar48;
    }
  }
  else if (tx_size == '\x11') {
    uVar35 = 9;
  }
  else {
    if (tx_size != '\x12') goto LAB_00255963;
    uVar35 = 10;
  }
  iVar44 = tx_size_high[uVar35];
  iVar45 = iVar44 + 4;
  if (tx_class == '\x01') {
    lVar37 = (long)(iVar45 * 2);
    lVar47 = (long)(iVar45 * 3);
    lVar43 = (long)(iVar45 * 4);
    if (iVar44 == 4) {
      lVar46 = 0;
      cVar53 = '\x1a';
      cVar55 = '\x1a';
      cVar56 = '\x1a';
      cVar57 = '\x1a';
      cVar58 = '\x1f';
      cVar59 = '\x1f';
      cVar60 = '\x1f';
      cVar51 = '\x1f';
      do {
        uVar15 = *(undefined4 *)(levels + lVar46 * 8 + 0x19);
        uVar16 = *(undefined4 *)(levels + lVar46 * 8 + 0x11);
        uVar17 = *(undefined4 *)(levels + lVar46 * 8 + 9);
        uVar18 = *(undefined4 *)(levels + lVar46 * 8 + 1);
        uVar19 = *(undefined4 *)(levels + lVar46 * 8 + 0x20);
        uVar20 = *(undefined4 *)(levels + lVar46 * 8 + 0x18);
        uVar21 = *(undefined4 *)(levels + lVar46 * 8 + 0x10);
        uVar22 = *(undefined4 *)(levels + lVar46 * 8 + 8);
        uVar23 = *(undefined4 *)(levels + lVar46 * 8 + lVar37 + 0x18);
        uVar24 = *(undefined4 *)(levels + lVar46 * 8 + lVar37 + 0x10);
        uVar25 = *(undefined4 *)(levels + lVar46 * 8 + lVar37 + 8);
        uVar26 = *(undefined4 *)(levels + lVar46 * 8 + lVar37);
        uVar27 = *(undefined4 *)(levels + lVar46 * 8 + lVar47 + 0x18);
        uVar28 = *(undefined4 *)(levels + lVar46 * 8 + lVar47 + 0x10);
        uVar29 = *(undefined4 *)(levels + lVar46 * 8 + lVar47 + 8);
        uVar30 = *(undefined4 *)(levels + lVar46 * 8 + lVar47);
        uVar31 = *(undefined4 *)(levels + lVar46 * 8 + lVar43 + 0x18);
        uVar32 = *(undefined4 *)(levels + lVar46 * 8 + lVar43 + 0x10);
        uVar33 = *(undefined4 *)(levels + lVar46 * 8 + lVar43 + 8);
        uVar34 = *(undefined4 *)(levels + lVar46 * 8 + lVar43);
        bVar176 = (byte)uVar18;
        bVar177 = (byte)((uint)uVar18 >> 8);
        bVar178 = (byte)((uint)uVar18 >> 0x10);
        bVar179 = (byte)((uint)uVar18 >> 0x18);
        bVar180 = (byte)uVar17;
        bVar181 = (byte)((uint)uVar17 >> 8);
        bVar182 = (byte)((uint)uVar17 >> 0x10);
        bVar183 = (byte)((uint)uVar17 >> 0x18);
        bVar184 = (byte)uVar16;
        bVar185 = (byte)((uint)uVar16 >> 8);
        bVar186 = (byte)((uint)uVar16 >> 0x10);
        bVar187 = (byte)((uint)uVar16 >> 0x18);
        bVar188 = (byte)uVar15;
        bVar189 = (byte)((uint)uVar15 >> 8);
        bVar190 = (byte)((uint)uVar15 >> 0x10);
        bVar191 = (byte)((uint)uVar15 >> 0x18);
        bVar112 = (byte)uVar22;
        bVar113 = (byte)((uint)uVar22 >> 8);
        bVar114 = (byte)((uint)uVar22 >> 0x10);
        bVar115 = (byte)((uint)uVar22 >> 0x18);
        bVar116 = (byte)uVar21;
        bVar117 = (byte)((uint)uVar21 >> 8);
        bVar118 = (byte)((uint)uVar21 >> 0x10);
        bVar119 = (byte)((uint)uVar21 >> 0x18);
        bVar120 = (byte)uVar20;
        bVar121 = (byte)((uint)uVar20 >> 8);
        bVar122 = (byte)((uint)uVar20 >> 0x10);
        bVar123 = (byte)((uint)uVar20 >> 0x18);
        bVar124 = (byte)uVar19;
        bVar125 = (byte)((uint)uVar19 >> 8);
        bVar126 = (byte)((uint)uVar19 >> 0x10);
        bVar127 = (byte)((uint)uVar19 >> 0x18);
        bVar128 = (byte)uVar26;
        bVar129 = (byte)((uint)uVar26 >> 8);
        bVar130 = (byte)((uint)uVar26 >> 0x10);
        bVar131 = (byte)((uint)uVar26 >> 0x18);
        bVar132 = (byte)uVar25;
        bVar133 = (byte)((uint)uVar25 >> 8);
        bVar134 = (byte)((uint)uVar25 >> 0x10);
        bVar135 = (byte)((uint)uVar25 >> 0x18);
        bVar136 = (byte)uVar24;
        bVar137 = (byte)((uint)uVar24 >> 8);
        bVar138 = (byte)((uint)uVar24 >> 0x10);
        bVar139 = (byte)((uint)uVar24 >> 0x18);
        bVar140 = (byte)uVar23;
        bVar141 = (byte)((uint)uVar23 >> 8);
        bVar142 = (byte)((uint)uVar23 >> 0x10);
        bVar143 = (byte)((uint)uVar23 >> 0x18);
        bVar144 = (byte)uVar30;
        bVar145 = (byte)((uint)uVar30 >> 8);
        bVar146 = (byte)((uint)uVar30 >> 0x10);
        bVar147 = (byte)((uint)uVar30 >> 0x18);
        bVar148 = (byte)uVar29;
        bVar149 = (byte)((uint)uVar29 >> 8);
        bVar150 = (byte)((uint)uVar29 >> 0x10);
        bVar151 = (byte)((uint)uVar29 >> 0x18);
        bVar152 = (byte)uVar28;
        bVar153 = (byte)((uint)uVar28 >> 8);
        bVar154 = (byte)((uint)uVar28 >> 0x10);
        bVar155 = (byte)((uint)uVar28 >> 0x18);
        bVar156 = (byte)uVar27;
        bVar157 = (byte)((uint)uVar27 >> 8);
        bVar158 = (byte)((uint)uVar27 >> 0x10);
        bVar159 = (byte)((uint)uVar27 >> 0x18);
        bVar160 = (byte)uVar34;
        bVar161 = (byte)((uint)uVar34 >> 8);
        bVar162 = (byte)((uint)uVar34 >> 0x10);
        bVar163 = (byte)((uint)uVar34 >> 0x18);
        bVar164 = (byte)uVar33;
        bVar165 = (byte)((uint)uVar33 >> 8);
        bVar166 = (byte)((uint)uVar33 >> 0x10);
        bVar167 = (byte)((uint)uVar33 >> 0x18);
        bVar168 = (byte)uVar32;
        bVar169 = (byte)((uint)uVar32 >> 8);
        bVar170 = (byte)((uint)uVar32 >> 0x10);
        bVar171 = (byte)((uint)uVar32 >> 0x18);
        bVar172 = (byte)uVar31;
        bVar173 = (byte)((uint)uVar31 >> 8);
        bVar174 = (byte)((uint)uVar31 >> 0x10);
        bVar175 = (byte)((uint)uVar31 >> 0x18);
        bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                        ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                        ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                        ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                        ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        piVar50 = coeff_contexts + lVar46 * 4;
        *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar53;
        piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar55;
        piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar56;
        piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar57;
        piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar58;
        piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar59;
        piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar60;
        piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar51;
        piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + 0x24;
        piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x24;
        piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x24;
        piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
        piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x24;
        piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x24;
        piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x24;
        piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
        lVar46 = lVar46 + 4;
        cVar53 = '$';
        cVar55 = '$';
        cVar56 = '$';
        cVar57 = '$';
        cVar58 = '$';
        cVar59 = '$';
        cVar60 = '$';
        cVar51 = '$';
      } while (iVar14 != (int)lVar46);
    }
    else if (iVar44 == 8) {
      puVar42 = levels + 0xc;
      lVar46 = 0;
      cVar53 = '\x1a';
      cVar55 = '\x1a';
      cVar56 = '\x1a';
      cVar57 = '\x1a';
      cVar58 = '\x1a';
      cVar59 = '\x1a';
      cVar60 = '\x1a';
      cVar51 = '\x1a';
      cVar61 = '\x1f';
      cVar63 = '\x1f';
      cVar65 = '\x1f';
      cVar67 = '\x1f';
      cVar68 = '\x1f';
      cVar69 = '\x1f';
      cVar70 = '\x1f';
      cVar52 = '\x1f';
      do {
        uVar3 = *(undefined8 *)(puVar42 + -0xb);
        uVar4 = *(undefined8 *)(puVar42 + 1);
        uVar5 = *(undefined8 *)puVar42;
        uVar6 = *(undefined8 *)(puVar42 + 0xc);
        uVar7 = *(undefined8 *)(puVar42 + lVar37 + -0xc);
        uVar8 = *(undefined8 *)(puVar42 + lVar37);
        uVar9 = *(undefined8 *)(puVar42 + lVar47 + -0xc);
        uVar10 = *(undefined8 *)(puVar42 + lVar47);
        uVar11 = *(undefined8 *)(puVar42 + lVar43 + -0xc);
        uVar12 = *(undefined8 *)(puVar42 + lVar43);
        bVar176 = (byte)uVar3;
        bVar177 = (byte)((ulong)uVar3 >> 8);
        bVar178 = (byte)((ulong)uVar3 >> 0x10);
        bVar179 = (byte)((ulong)uVar3 >> 0x18);
        bVar180 = (byte)((ulong)uVar3 >> 0x20);
        bVar181 = (byte)((ulong)uVar3 >> 0x28);
        bVar182 = (byte)((ulong)uVar3 >> 0x30);
        bVar183 = (byte)((ulong)uVar3 >> 0x38);
        bVar184 = (byte)uVar4;
        bVar185 = (byte)((ulong)uVar4 >> 8);
        bVar186 = (byte)((ulong)uVar4 >> 0x10);
        bVar187 = (byte)((ulong)uVar4 >> 0x18);
        bVar188 = (byte)((ulong)uVar4 >> 0x20);
        bVar189 = (byte)((ulong)uVar4 >> 0x28);
        bVar190 = (byte)((ulong)uVar4 >> 0x30);
        bVar191 = (byte)((ulong)uVar4 >> 0x38);
        bVar112 = (byte)uVar5;
        bVar113 = (byte)((ulong)uVar5 >> 8);
        bVar114 = (byte)((ulong)uVar5 >> 0x10);
        bVar115 = (byte)((ulong)uVar5 >> 0x18);
        bVar116 = (byte)((ulong)uVar5 >> 0x20);
        bVar117 = (byte)((ulong)uVar5 >> 0x28);
        bVar118 = (byte)((ulong)uVar5 >> 0x30);
        bVar119 = (byte)((ulong)uVar5 >> 0x38);
        bVar120 = (byte)uVar6;
        bVar121 = (byte)((ulong)uVar6 >> 8);
        bVar122 = (byte)((ulong)uVar6 >> 0x10);
        bVar123 = (byte)((ulong)uVar6 >> 0x18);
        bVar124 = (byte)((ulong)uVar6 >> 0x20);
        bVar125 = (byte)((ulong)uVar6 >> 0x28);
        bVar126 = (byte)((ulong)uVar6 >> 0x30);
        bVar127 = (byte)((ulong)uVar6 >> 0x38);
        bVar128 = (byte)uVar7;
        bVar129 = (byte)((ulong)uVar7 >> 8);
        bVar130 = (byte)((ulong)uVar7 >> 0x10);
        bVar131 = (byte)((ulong)uVar7 >> 0x18);
        bVar132 = (byte)((ulong)uVar7 >> 0x20);
        bVar133 = (byte)((ulong)uVar7 >> 0x28);
        bVar134 = (byte)((ulong)uVar7 >> 0x30);
        bVar135 = (byte)((ulong)uVar7 >> 0x38);
        bVar136 = (byte)uVar8;
        bVar137 = (byte)((ulong)uVar8 >> 8);
        bVar138 = (byte)((ulong)uVar8 >> 0x10);
        bVar139 = (byte)((ulong)uVar8 >> 0x18);
        bVar140 = (byte)((ulong)uVar8 >> 0x20);
        bVar141 = (byte)((ulong)uVar8 >> 0x28);
        bVar142 = (byte)((ulong)uVar8 >> 0x30);
        bVar143 = (byte)((ulong)uVar8 >> 0x38);
        bVar144 = (byte)uVar9;
        bVar145 = (byte)((ulong)uVar9 >> 8);
        bVar146 = (byte)((ulong)uVar9 >> 0x10);
        bVar147 = (byte)((ulong)uVar9 >> 0x18);
        bVar148 = (byte)((ulong)uVar9 >> 0x20);
        bVar149 = (byte)((ulong)uVar9 >> 0x28);
        bVar150 = (byte)((ulong)uVar9 >> 0x30);
        bVar151 = (byte)((ulong)uVar9 >> 0x38);
        bVar152 = (byte)uVar10;
        bVar153 = (byte)((ulong)uVar10 >> 8);
        bVar154 = (byte)((ulong)uVar10 >> 0x10);
        bVar155 = (byte)((ulong)uVar10 >> 0x18);
        bVar156 = (byte)((ulong)uVar10 >> 0x20);
        bVar157 = (byte)((ulong)uVar10 >> 0x28);
        bVar158 = (byte)((ulong)uVar10 >> 0x30);
        bVar159 = (byte)((ulong)uVar10 >> 0x38);
        bVar160 = (byte)uVar11;
        bVar161 = (byte)((ulong)uVar11 >> 8);
        bVar162 = (byte)((ulong)uVar11 >> 0x10);
        bVar163 = (byte)((ulong)uVar11 >> 0x18);
        bVar164 = (byte)((ulong)uVar11 >> 0x20);
        bVar165 = (byte)((ulong)uVar11 >> 0x28);
        bVar166 = (byte)((ulong)uVar11 >> 0x30);
        bVar167 = (byte)((ulong)uVar11 >> 0x38);
        bVar168 = (byte)uVar12;
        bVar169 = (byte)((ulong)uVar12 >> 8);
        bVar170 = (byte)((ulong)uVar12 >> 0x10);
        bVar171 = (byte)((ulong)uVar12 >> 0x18);
        bVar172 = (byte)((ulong)uVar12 >> 0x20);
        bVar173 = (byte)((ulong)uVar12 >> 0x28);
        bVar174 = (byte)((ulong)uVar12 >> 0x30);
        bVar175 = (byte)((ulong)uVar12 >> 0x38);
        bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                        ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                        ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                        ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                        ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        piVar50 = coeff_contexts + lVar46 * 8;
        *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar53;
        piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar55;
        piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar56;
        piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar57;
        piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar58;
        piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar59;
        piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar60;
        piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar51;
        piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar61;
        piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar63;
        piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar65;
        piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar67;
        piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar68;
        piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar69;
        piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar70;
        piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar52;
        lVar46 = lVar46 + 2;
        puVar42 = puVar42 + 0x18;
        cVar53 = '$';
        cVar55 = '$';
        cVar56 = '$';
        cVar57 = '$';
        cVar58 = '$';
        cVar59 = '$';
        cVar60 = '$';
        cVar51 = '$';
        cVar61 = '$';
        cVar63 = '$';
        cVar65 = '$';
        cVar67 = '$';
        cVar68 = '$';
        cVar69 = '$';
        cVar70 = '$';
        cVar52 = '$';
      } while (iVar14 != (int)lVar46);
    }
    else {
      piVar50 = coeff_contexts;
      iVar41 = iVar14;
      cVar53 = '\x1a';
      cVar55 = '\x1a';
      cVar56 = '\x1a';
      cVar57 = '\x1a';
      cVar58 = '\x1a';
      cVar59 = '\x1a';
      cVar60 = '\x1a';
      cVar51 = '\x1a';
      cVar61 = '\x1a';
      cVar63 = '\x1a';
      cVar65 = '\x1a';
      cVar67 = '\x1a';
      cVar68 = '\x1a';
      cVar69 = '\x1a';
      cVar70 = '\x1a';
      cVar52 = '\x1a';
      cVar54 = '\x1f';
      cVar62 = '\x1f';
      cVar64 = '\x1f';
      cVar66 = '\x1f';
      cVar80 = '\x1f';
      cVar82 = '\x1f';
      cVar84 = '\x1f';
      cVar86 = '\x1f';
      cVar88 = '\x1f';
      cVar90 = '\x1f';
      cVar92 = '\x1f';
      cVar94 = '\x1f';
      cVar96 = '\x1f';
      cVar98 = '\x1f';
      cVar100 = '\x1f';
      cVar102 = '\x1f';
      do {
        lVar46 = 0;
        do {
          lVar49 = lVar46;
          pbVar1 = levels + lVar49 + 1;
          bVar176 = *pbVar1;
          bVar177 = pbVar1[1];
          bVar178 = pbVar1[2];
          bVar179 = pbVar1[3];
          bVar180 = pbVar1[4];
          bVar181 = pbVar1[5];
          bVar182 = pbVar1[6];
          bVar183 = pbVar1[7];
          bVar184 = pbVar1[8];
          bVar185 = pbVar1[9];
          bVar186 = pbVar1[10];
          bVar187 = pbVar1[0xb];
          bVar188 = pbVar1[0xc];
          bVar189 = pbVar1[0xd];
          bVar190 = pbVar1[0xe];
          bVar191 = pbVar1[0xf];
          pbVar1 = levels + lVar49 + iVar45;
          bVar112 = *pbVar1;
          bVar113 = pbVar1[1];
          bVar114 = pbVar1[2];
          bVar115 = pbVar1[3];
          bVar116 = pbVar1[4];
          bVar117 = pbVar1[5];
          bVar118 = pbVar1[6];
          bVar119 = pbVar1[7];
          bVar120 = pbVar1[8];
          bVar121 = pbVar1[9];
          bVar122 = pbVar1[10];
          bVar123 = pbVar1[0xb];
          bVar124 = pbVar1[0xc];
          bVar125 = pbVar1[0xd];
          bVar126 = pbVar1[0xe];
          bVar127 = pbVar1[0xf];
          pbVar1 = levels + lVar49 + lVar37;
          bVar128 = *pbVar1;
          bVar129 = pbVar1[1];
          bVar130 = pbVar1[2];
          bVar131 = pbVar1[3];
          bVar132 = pbVar1[4];
          bVar133 = pbVar1[5];
          bVar134 = pbVar1[6];
          bVar135 = pbVar1[7];
          bVar136 = pbVar1[8];
          bVar137 = pbVar1[9];
          bVar138 = pbVar1[10];
          bVar139 = pbVar1[0xb];
          bVar140 = pbVar1[0xc];
          bVar141 = pbVar1[0xd];
          bVar142 = pbVar1[0xe];
          bVar143 = pbVar1[0xf];
          pbVar1 = levels + lVar49 + lVar47;
          bVar144 = *pbVar1;
          bVar145 = pbVar1[1];
          bVar146 = pbVar1[2];
          bVar147 = pbVar1[3];
          bVar148 = pbVar1[4];
          bVar149 = pbVar1[5];
          bVar150 = pbVar1[6];
          bVar151 = pbVar1[7];
          bVar152 = pbVar1[8];
          bVar153 = pbVar1[9];
          bVar154 = pbVar1[10];
          bVar155 = pbVar1[0xb];
          bVar156 = pbVar1[0xc];
          bVar157 = pbVar1[0xd];
          bVar158 = pbVar1[0xe];
          bVar159 = pbVar1[0xf];
          pbVar1 = levels + lVar49 + lVar43;
          bVar160 = *pbVar1;
          bVar161 = pbVar1[1];
          bVar162 = pbVar1[2];
          bVar163 = pbVar1[3];
          bVar164 = pbVar1[4];
          bVar165 = pbVar1[5];
          bVar166 = pbVar1[6];
          bVar167 = pbVar1[7];
          bVar168 = pbVar1[8];
          bVar169 = pbVar1[9];
          bVar170 = pbVar1[10];
          bVar171 = pbVar1[0xb];
          bVar172 = pbVar1[0xc];
          bVar173 = pbVar1[0xd];
          bVar174 = pbVar1[0xe];
          bVar175 = pbVar1[0xf];
          bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                          ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                          ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                          ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                          ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
          bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                          ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                          ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                          ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                          ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
          bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                          ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                          ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                          ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                          ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
          bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                          ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                          ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                          ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                          ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
          bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                          ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                          ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                          ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                          ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
          bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                          ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                          ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                          ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                          ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
          bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                          ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                          ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                          ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                          ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
          bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                          ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                          ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                          ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                          ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
          bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                          ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                          ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                          ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                          ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
          bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                          ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                          ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                          ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                          ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
          bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                          ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                          ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                          ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                          ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
          bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                          ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                          ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                          ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                          ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
          bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                          ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                          ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                          ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                          ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
          bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                          ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                          ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                          ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                          ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
          bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                          ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                          ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                          ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                          ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
          bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                          ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                          ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                          ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                          ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
          piVar2 = piVar50 + lVar49;
          *piVar2 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar53;
          piVar2[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar55;
          piVar2[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar56;
          piVar2[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar57;
          piVar2[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar58;
          piVar2[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar59;
          piVar2[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar60;
          piVar2[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar51;
          piVar2[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar61;
          piVar2[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar63;
          piVar2[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar65;
          piVar2[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar67;
          piVar2[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar68;
          piVar2[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar69;
          piVar2[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar70;
          piVar2[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar52;
          lVar46 = lVar49 + 0x10;
        } while (iVar44 != (int)lVar46);
        levels = levels + lVar49 + 0x14;
        piVar50 = piVar50 + lVar46;
        iVar41 = iVar41 + -1;
        cVar53 = cVar54;
        cVar55 = cVar62;
        cVar56 = cVar64;
        cVar57 = cVar66;
        cVar58 = cVar80;
        cVar59 = cVar82;
        cVar60 = cVar84;
        cVar51 = cVar86;
        cVar61 = cVar88;
        cVar63 = cVar90;
        cVar65 = cVar92;
        cVar67 = cVar94;
        cVar68 = cVar96;
        cVar69 = cVar98;
        cVar70 = cVar100;
        cVar52 = cVar102;
        cVar54 = '$';
        cVar62 = '$';
        cVar64 = '$';
        cVar66 = '$';
        cVar80 = '$';
        cVar82 = '$';
        cVar84 = '$';
        cVar86 = '$';
        cVar88 = '$';
        cVar90 = '$';
        cVar92 = '$';
        cVar94 = '$';
        cVar96 = '$';
        cVar98 = '$';
        cVar100 = '$';
        cVar102 = '$';
      } while (iVar41 != 0);
    }
  }
  else if (tx_class == '\0') {
    iVar41 = *(int *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
    iVar40 = *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
    lVar37 = (long)(iVar44 + 5);
    lVar43 = (long)(iVar45 * 2);
    if (iVar44 == 0x10) {
      piVar50 = coeff_contexts;
      iVar45 = iVar14;
      if (iVar41 == iVar40) {
        cVar58 = '\0';
        cVar59 = '\x01';
        cVar60 = '\x06';
        cVar51 = '\x06';
        cVar61 = '\x15';
        cVar63 = '\x15';
        cVar65 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
        cVar52 = '\x15';
        cVar54 = '\x15';
        cVar62 = '\x15';
        cVar64 = '\x15';
        cVar66 = '\x15';
        cVar56 = '\x06';
        cVar57 = '\x06';
        cVar55 = '\x15';
        cVar53 = '\x15';
        cVar80 = '\x01';
        cVar82 = '\x06';
        cVar84 = cVar60;
        cVar86 = '\x15';
        cVar88 = cVar61;
        cVar90 = cVar63;
        cVar92 = cVar65;
        cVar94 = cVar67;
        cVar96 = cVar68;
        cVar98 = cVar69;
        cVar100 = cVar70;
        cVar102 = cVar52;
        cVar104 = cVar54;
        cVar106 = cVar62;
        cVar108 = cVar64;
        cVar110 = cVar66;
        cVar71 = cVar56;
      }
      else {
        cVar56 = '\v';
        cVar57 = '\v';
        cVar53 = cVar56;
        cVar55 = cVar57;
        if (iVar40 <= iVar41) {
          cVar53 = '\x15';
          cVar55 = '\x15';
          cVar56 = '\x06';
          cVar57 = '\x06';
        }
        cVar58 = '\x10';
        cVar59 = '\x10';
        cVar60 = '\x10';
        cVar51 = '\x10';
        cVar61 = '\x10';
        cVar63 = '\x10';
        cVar65 = '\x10';
        cVar67 = '\x10';
        cVar68 = '\x10';
        cVar69 = '\x10';
        cVar70 = '\x10';
        cVar52 = '\x10';
        cVar54 = '\x10';
        cVar62 = '\x10';
        cVar64 = '\x10';
        cVar66 = '\x10';
        cVar80 = cVar58;
        cVar82 = cVar59;
        cVar84 = cVar60;
        cVar86 = cVar51;
        cVar88 = cVar61;
        cVar90 = cVar63;
        cVar92 = cVar65;
        cVar94 = cVar67;
        cVar96 = cVar68;
        cVar98 = cVar69;
        cVar100 = cVar70;
        cVar102 = cVar52;
        cVar104 = cVar54;
        cVar106 = cVar62;
        cVar108 = cVar64;
        cVar110 = cVar66;
        cVar71 = cVar56;
        if (iVar41 < iVar40) {
          cVar58 = '\0';
          cVar59 = '\v';
          cVar60 = '\x06';
          cVar51 = '\x06';
          cVar61 = '\x15';
          cVar63 = '\x15';
          cVar65 = '\x15';
          cVar67 = '\x15';
          cVar68 = '\x15';
          cVar69 = '\x15';
          cVar70 = '\x15';
          cVar52 = '\x15';
          cVar54 = '\x15';
          cVar62 = '\x15';
          cVar64 = '\x15';
          cVar66 = '\x15';
          cVar80 = '\v';
          cVar82 = '\v';
          cVar84 = cVar60;
          cVar86 = '\x15';
          cVar88 = cVar61;
          cVar90 = cVar63;
          cVar92 = cVar65;
          cVar94 = cVar67;
          cVar96 = cVar68;
          cVar98 = cVar69;
          cVar100 = cVar70;
          cVar102 = cVar52;
          cVar104 = cVar54;
          cVar106 = cVar62;
          cVar108 = cVar64;
          cVar110 = cVar66;
        }
      }
      do {
        bVar176 = levels[1];
        bVar177 = levels[2];
        bVar178 = levels[3];
        bVar179 = levels[4];
        bVar180 = levels[5];
        bVar181 = levels[6];
        bVar182 = levels[7];
        bVar183 = levels[8];
        bVar184 = levels[9];
        bVar185 = levels[10];
        bVar186 = levels[0xb];
        bVar187 = levels[0xc];
        bVar188 = levels[0xd];
        bVar189 = levels[0xe];
        bVar190 = levels[0xf];
        bVar191 = levels[0x10];
        bVar112 = levels[2];
        bVar113 = levels[3];
        bVar114 = levels[4];
        bVar115 = levels[5];
        bVar116 = levels[6];
        bVar117 = levels[7];
        bVar118 = levels[8];
        bVar119 = levels[9];
        bVar120 = levels[10];
        bVar121 = levels[0xb];
        bVar122 = levels[0xc];
        bVar123 = levels[0xd];
        bVar124 = levels[0xe];
        bVar125 = levels[0xf];
        bVar126 = levels[0x10];
        bVar127 = levels[0x11];
        bVar128 = levels[0x14];
        bVar129 = levels[0x15];
        bVar130 = levels[0x16];
        bVar131 = levels[0x17];
        bVar132 = levels[0x18];
        bVar133 = levels[0x19];
        bVar134 = levels[0x1a];
        bVar135 = levels[0x1b];
        bVar136 = levels[0x1c];
        bVar137 = levels[0x1d];
        bVar138 = levels[0x1e];
        bVar139 = levels[0x1f];
        bVar140 = levels[0x20];
        bVar141 = levels[0x21];
        bVar142 = levels[0x22];
        bVar143 = levels[0x23];
        pbVar1 = levels + lVar37;
        bVar144 = *pbVar1;
        bVar145 = pbVar1[1];
        bVar146 = pbVar1[2];
        bVar147 = pbVar1[3];
        bVar148 = pbVar1[4];
        bVar149 = pbVar1[5];
        bVar150 = pbVar1[6];
        bVar151 = pbVar1[7];
        bVar152 = pbVar1[8];
        bVar153 = pbVar1[9];
        bVar154 = pbVar1[10];
        bVar155 = pbVar1[0xb];
        bVar156 = pbVar1[0xc];
        bVar157 = pbVar1[0xd];
        bVar158 = pbVar1[0xe];
        bVar159 = pbVar1[0xf];
        pbVar1 = levels + lVar43;
        bVar160 = *pbVar1;
        bVar161 = pbVar1[1];
        bVar162 = pbVar1[2];
        bVar163 = pbVar1[3];
        bVar164 = pbVar1[4];
        bVar165 = pbVar1[5];
        bVar166 = pbVar1[6];
        bVar167 = pbVar1[7];
        bVar168 = pbVar1[8];
        bVar169 = pbVar1[9];
        bVar170 = pbVar1[10];
        bVar171 = pbVar1[0xb];
        bVar172 = pbVar1[0xc];
        bVar173 = pbVar1[0xd];
        bVar174 = pbVar1[0xe];
        bVar175 = pbVar1[0xf];
        bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                        ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                        ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                        ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                        ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar58;
        piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar59;
        piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar60;
        piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar51;
        piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar61;
        piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar63;
        piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar65;
        piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar67;
        piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar68;
        piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar69;
        piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar70;
        piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar52;
        piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar54;
        piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar62;
        piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar64;
        piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar66;
        levels = levels + 0x14;
        iVar45 = iVar45 + -1;
        piVar50 = piVar50 + 0x10;
        cVar58 = cVar80;
        cVar59 = cVar82;
        cVar60 = cVar84;
        cVar51 = cVar86;
        cVar61 = cVar88;
        cVar63 = cVar90;
        cVar65 = cVar92;
        cVar67 = cVar94;
        cVar68 = cVar96;
        cVar69 = cVar98;
        cVar70 = cVar100;
        cVar52 = cVar102;
        cVar54 = cVar104;
        cVar62 = cVar106;
        cVar64 = cVar108;
        cVar66 = cVar110;
        cVar80 = cVar56;
        cVar82 = cVar57;
        cVar84 = '\x15';
        cVar86 = '\x15';
        cVar88 = '\x15';
        cVar90 = '\x15';
        cVar92 = '\x15';
        cVar94 = '\x15';
        cVar96 = '\x15';
        cVar98 = '\x15';
        cVar100 = '\x15';
        cVar102 = '\x15';
        cVar104 = '\x15';
        cVar106 = '\x15';
        cVar108 = '\x15';
        cVar110 = '\x15';
        cVar56 = cVar71;
        cVar57 = cVar55;
        cVar71 = cVar53;
      } while (iVar45 != 0);
    }
    else if (iVar44 == 8) {
      if ((0x80c2UL >> (uVar36 & 0x3f) & 1) == 0) {
        if ((0x2021UL >> (uVar36 & 0x3f) & 1) == 0) {
          cVar52 = '\x06';
          cVar54 = '\x06';
          cVar62 = '\x06';
          cVar64 = '\x15';
          cVar53 = '\x10';
          cVar55 = '\x10';
          cVar56 = '\x10';
          cVar57 = '\x10';
          cVar58 = '\x10';
          cVar59 = '\x10';
          cVar60 = '\x10';
          cVar51 = '\x10';
          cVar61 = '\x10';
          cVar63 = '\x10';
          cVar65 = '\x10';
          cVar67 = '\x10';
          cVar68 = '\x10';
          cVar69 = '\x10';
          cVar70 = '\x10';
        }
        else {
          cVar52 = '\v';
          cVar54 = '\v';
          cVar62 = '\v';
          cVar64 = '\v';
          cVar53 = '\v';
          cVar55 = '\x06';
          cVar56 = '\x06';
          cVar57 = '\x15';
          cVar58 = '\x15';
          cVar59 = '\x15';
          cVar60 = '\x15';
          cVar51 = '\v';
          cVar61 = '\v';
          cVar63 = '\x06';
          cVar65 = '\x15';
          cVar67 = '\x15';
          cVar68 = '\x15';
          cVar69 = '\x15';
          cVar70 = '\x15';
        }
      }
      else {
        cVar53 = '\x01';
        cVar55 = '\x06';
        cVar56 = '\x06';
        cVar57 = '\x15';
        cVar58 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar51 = '\x01';
        cVar61 = '\x06';
        cVar63 = '\x06';
        cVar65 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
        cVar52 = '\x06';
        cVar54 = '\x06';
        cVar62 = '\x06';
        cVar64 = '\x15';
      }
      puVar42 = levels + 0xc;
      lVar47 = 0;
      cVar66 = '\0';
      do {
        uVar3 = *(undefined8 *)(puVar42 + -0xb);
        uVar4 = *(undefined8 *)(puVar42 + 1);
        uVar5 = *(undefined8 *)puVar42;
        uVar6 = *(undefined8 *)(puVar42 + 0xc);
        uVar7 = *(undefined8 *)(puVar42 + -10);
        uVar8 = *(undefined8 *)(puVar42 + 2);
        uVar9 = *(undefined8 *)(puVar42 + lVar37 + -0xc);
        uVar10 = *(undefined8 *)(puVar42 + lVar37);
        uVar11 = *(undefined8 *)(puVar42 + lVar43 + -0xc);
        uVar12 = *(undefined8 *)(puVar42 + lVar43);
        bVar176 = (byte)uVar3;
        bVar177 = (byte)((ulong)uVar3 >> 8);
        bVar178 = (byte)((ulong)uVar3 >> 0x10);
        bVar179 = (byte)((ulong)uVar3 >> 0x18);
        bVar180 = (byte)((ulong)uVar3 >> 0x20);
        bVar181 = (byte)((ulong)uVar3 >> 0x28);
        bVar182 = (byte)((ulong)uVar3 >> 0x30);
        bVar183 = (byte)((ulong)uVar3 >> 0x38);
        bVar184 = (byte)uVar4;
        bVar185 = (byte)((ulong)uVar4 >> 8);
        bVar186 = (byte)((ulong)uVar4 >> 0x10);
        bVar187 = (byte)((ulong)uVar4 >> 0x18);
        bVar188 = (byte)((ulong)uVar4 >> 0x20);
        bVar189 = (byte)((ulong)uVar4 >> 0x28);
        bVar190 = (byte)((ulong)uVar4 >> 0x30);
        bVar191 = (byte)((ulong)uVar4 >> 0x38);
        bVar112 = (byte)uVar5;
        bVar113 = (byte)((ulong)uVar5 >> 8);
        bVar114 = (byte)((ulong)uVar5 >> 0x10);
        bVar115 = (byte)((ulong)uVar5 >> 0x18);
        bVar116 = (byte)((ulong)uVar5 >> 0x20);
        bVar117 = (byte)((ulong)uVar5 >> 0x28);
        bVar118 = (byte)((ulong)uVar5 >> 0x30);
        bVar119 = (byte)((ulong)uVar5 >> 0x38);
        bVar120 = (byte)uVar6;
        bVar121 = (byte)((ulong)uVar6 >> 8);
        bVar122 = (byte)((ulong)uVar6 >> 0x10);
        bVar123 = (byte)((ulong)uVar6 >> 0x18);
        bVar124 = (byte)((ulong)uVar6 >> 0x20);
        bVar125 = (byte)((ulong)uVar6 >> 0x28);
        bVar126 = (byte)((ulong)uVar6 >> 0x30);
        bVar127 = (byte)((ulong)uVar6 >> 0x38);
        bVar128 = (byte)uVar7;
        bVar129 = (byte)((ulong)uVar7 >> 8);
        bVar130 = (byte)((ulong)uVar7 >> 0x10);
        bVar131 = (byte)((ulong)uVar7 >> 0x18);
        bVar132 = (byte)((ulong)uVar7 >> 0x20);
        bVar133 = (byte)((ulong)uVar7 >> 0x28);
        bVar134 = (byte)((ulong)uVar7 >> 0x30);
        bVar135 = (byte)((ulong)uVar7 >> 0x38);
        bVar136 = (byte)uVar8;
        bVar137 = (byte)((ulong)uVar8 >> 8);
        bVar138 = (byte)((ulong)uVar8 >> 0x10);
        bVar139 = (byte)((ulong)uVar8 >> 0x18);
        bVar140 = (byte)((ulong)uVar8 >> 0x20);
        bVar141 = (byte)((ulong)uVar8 >> 0x28);
        bVar142 = (byte)((ulong)uVar8 >> 0x30);
        bVar143 = (byte)((ulong)uVar8 >> 0x38);
        bVar144 = (byte)uVar9;
        bVar145 = (byte)((ulong)uVar9 >> 8);
        bVar146 = (byte)((ulong)uVar9 >> 0x10);
        bVar147 = (byte)((ulong)uVar9 >> 0x18);
        bVar148 = (byte)((ulong)uVar9 >> 0x20);
        bVar149 = (byte)((ulong)uVar9 >> 0x28);
        bVar150 = (byte)((ulong)uVar9 >> 0x30);
        bVar151 = (byte)((ulong)uVar9 >> 0x38);
        bVar152 = (byte)uVar10;
        bVar153 = (byte)((ulong)uVar10 >> 8);
        bVar154 = (byte)((ulong)uVar10 >> 0x10);
        bVar155 = (byte)((ulong)uVar10 >> 0x18);
        bVar156 = (byte)((ulong)uVar10 >> 0x20);
        bVar157 = (byte)((ulong)uVar10 >> 0x28);
        bVar158 = (byte)((ulong)uVar10 >> 0x30);
        bVar159 = (byte)((ulong)uVar10 >> 0x38);
        bVar160 = (byte)uVar11;
        bVar161 = (byte)((ulong)uVar11 >> 8);
        bVar162 = (byte)((ulong)uVar11 >> 0x10);
        bVar163 = (byte)((ulong)uVar11 >> 0x18);
        bVar164 = (byte)((ulong)uVar11 >> 0x20);
        bVar165 = (byte)((ulong)uVar11 >> 0x28);
        bVar166 = (byte)((ulong)uVar11 >> 0x30);
        bVar167 = (byte)((ulong)uVar11 >> 0x38);
        bVar168 = (byte)uVar12;
        bVar169 = (byte)((ulong)uVar12 >> 8);
        bVar170 = (byte)((ulong)uVar12 >> 0x10);
        bVar171 = (byte)((ulong)uVar12 >> 0x18);
        bVar172 = (byte)((ulong)uVar12 >> 0x20);
        bVar173 = (byte)((ulong)uVar12 >> 0x28);
        bVar174 = (byte)((ulong)uVar12 >> 0x30);
        bVar175 = (byte)((ulong)uVar12 >> 0x38);
        bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                        ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                        ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                        ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                        ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        piVar50 = coeff_contexts + lVar47 * 8;
        *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar66;
        piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar53;
        piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar55;
        piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar56;
        piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar57;
        piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar58;
        piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar59;
        piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar60;
        piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar51;
        piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar61;
        piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar63;
        piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar65;
        piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar67;
        piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar68;
        piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar69;
        piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar70;
        lVar47 = lVar47 + 2;
        puVar42 = puVar42 + 0x18;
        cVar66 = cVar52;
        cVar53 = cVar54;
        cVar55 = '\x15';
        cVar56 = '\x15';
        cVar57 = '\x15';
        cVar58 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar51 = cVar62;
        cVar61 = cVar64;
        cVar63 = '\x15';
        cVar65 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
        cVar52 = '\x15';
        cVar54 = '\x15';
        cVar62 = '\x15';
        cVar64 = '\x15';
      } while (iVar14 != (int)lVar47);
    }
    else if (iVar44 == 4) {
      if ((0x2021UL >> (uVar36 & 0x3f) & 1) == 0) {
        cVar53 = '\x10';
        cVar55 = '\x10';
        cVar56 = '\x10';
        cVar57 = '\x10';
        cVar58 = '\x10';
        cVar59 = '\x10';
        cVar60 = '\x10';
      }
      else {
        cVar53 = '\x01';
        cVar55 = '\x06';
        cVar56 = '\x06';
        cVar57 = '\x01';
        cVar58 = '\x06';
        cVar59 = '\x06';
        cVar60 = '\x15';
      }
      lVar47 = 0;
      cVar51 = '\0';
      cVar61 = '\x06';
      cVar63 = '\x06';
      cVar65 = '\x06';
      do {
        uVar15 = *(undefined4 *)(levels + lVar47 * 8 + 0x19);
        uVar16 = *(undefined4 *)(levels + lVar47 * 8 + 0x11);
        uVar17 = *(undefined4 *)(levels + lVar47 * 8 + 9);
        uVar18 = *(undefined4 *)(levels + lVar47 * 8 + 1);
        uVar19 = *(undefined4 *)(levels + lVar47 * 8 + 0x20);
        uVar20 = *(undefined4 *)(levels + lVar47 * 8 + 0x18);
        uVar21 = *(undefined4 *)(levels + lVar47 * 8 + 0x10);
        uVar22 = *(undefined4 *)(levels + lVar47 * 8 + 8);
        uVar23 = *(undefined4 *)(levels + lVar47 * 8 + 0x1a);
        uVar24 = *(undefined4 *)(levels + lVar47 * 8 + 0x12);
        uVar25 = *(undefined4 *)(levels + lVar47 * 8 + 10);
        uVar26 = *(undefined4 *)(levels + lVar47 * 8 + 2);
        uVar27 = *(undefined4 *)(levels + lVar47 * 8 + lVar37 + 0x18);
        uVar28 = *(undefined4 *)(levels + lVar47 * 8 + lVar37 + 0x10);
        uVar29 = *(undefined4 *)(levels + lVar47 * 8 + lVar37 + 8);
        uVar30 = *(undefined4 *)(levels + lVar47 * 8 + lVar37);
        uVar31 = *(undefined4 *)(levels + lVar47 * 8 + lVar43 + 0x18);
        uVar32 = *(undefined4 *)(levels + lVar47 * 8 + lVar43 + 0x10);
        uVar33 = *(undefined4 *)(levels + lVar47 * 8 + lVar43 + 8);
        uVar34 = *(undefined4 *)(levels + lVar47 * 8 + lVar43);
        bVar176 = (byte)uVar18;
        bVar177 = (byte)((uint)uVar18 >> 8);
        bVar178 = (byte)((uint)uVar18 >> 0x10);
        bVar179 = (byte)((uint)uVar18 >> 0x18);
        bVar180 = (byte)uVar17;
        bVar181 = (byte)((uint)uVar17 >> 8);
        bVar182 = (byte)((uint)uVar17 >> 0x10);
        bVar183 = (byte)((uint)uVar17 >> 0x18);
        bVar184 = (byte)uVar16;
        bVar185 = (byte)((uint)uVar16 >> 8);
        bVar186 = (byte)((uint)uVar16 >> 0x10);
        bVar187 = (byte)((uint)uVar16 >> 0x18);
        bVar188 = (byte)uVar15;
        bVar189 = (byte)((uint)uVar15 >> 8);
        bVar190 = (byte)((uint)uVar15 >> 0x10);
        bVar191 = (byte)((uint)uVar15 >> 0x18);
        bVar112 = (byte)uVar22;
        bVar113 = (byte)((uint)uVar22 >> 8);
        bVar114 = (byte)((uint)uVar22 >> 0x10);
        bVar115 = (byte)((uint)uVar22 >> 0x18);
        bVar116 = (byte)uVar21;
        bVar117 = (byte)((uint)uVar21 >> 8);
        bVar118 = (byte)((uint)uVar21 >> 0x10);
        bVar119 = (byte)((uint)uVar21 >> 0x18);
        bVar120 = (byte)uVar20;
        bVar121 = (byte)((uint)uVar20 >> 8);
        bVar122 = (byte)((uint)uVar20 >> 0x10);
        bVar123 = (byte)((uint)uVar20 >> 0x18);
        bVar124 = (byte)uVar19;
        bVar125 = (byte)((uint)uVar19 >> 8);
        bVar126 = (byte)((uint)uVar19 >> 0x10);
        bVar127 = (byte)((uint)uVar19 >> 0x18);
        bVar128 = (byte)uVar26;
        bVar129 = (byte)((uint)uVar26 >> 8);
        bVar130 = (byte)((uint)uVar26 >> 0x10);
        bVar131 = (byte)((uint)uVar26 >> 0x18);
        bVar132 = (byte)uVar25;
        bVar133 = (byte)((uint)uVar25 >> 8);
        bVar134 = (byte)((uint)uVar25 >> 0x10);
        bVar135 = (byte)((uint)uVar25 >> 0x18);
        bVar136 = (byte)uVar24;
        bVar137 = (byte)((uint)uVar24 >> 8);
        bVar138 = (byte)((uint)uVar24 >> 0x10);
        bVar139 = (byte)((uint)uVar24 >> 0x18);
        bVar140 = (byte)uVar23;
        bVar141 = (byte)((uint)uVar23 >> 8);
        bVar142 = (byte)((uint)uVar23 >> 0x10);
        bVar143 = (byte)((uint)uVar23 >> 0x18);
        bVar144 = (byte)uVar30;
        bVar145 = (byte)((uint)uVar30 >> 8);
        bVar146 = (byte)((uint)uVar30 >> 0x10);
        bVar147 = (byte)((uint)uVar30 >> 0x18);
        bVar148 = (byte)uVar29;
        bVar149 = (byte)((uint)uVar29 >> 8);
        bVar150 = (byte)((uint)uVar29 >> 0x10);
        bVar151 = (byte)((uint)uVar29 >> 0x18);
        bVar152 = (byte)uVar28;
        bVar153 = (byte)((uint)uVar28 >> 8);
        bVar154 = (byte)((uint)uVar28 >> 0x10);
        bVar155 = (byte)((uint)uVar28 >> 0x18);
        bVar156 = (byte)uVar27;
        bVar157 = (byte)((uint)uVar27 >> 8);
        bVar158 = (byte)((uint)uVar27 >> 0x10);
        bVar159 = (byte)((uint)uVar27 >> 0x18);
        bVar160 = (byte)uVar34;
        bVar161 = (byte)((uint)uVar34 >> 8);
        bVar162 = (byte)((uint)uVar34 >> 0x10);
        bVar163 = (byte)((uint)uVar34 >> 0x18);
        bVar164 = (byte)uVar33;
        bVar165 = (byte)((uint)uVar33 >> 8);
        bVar166 = (byte)((uint)uVar33 >> 0x10);
        bVar167 = (byte)((uint)uVar33 >> 0x18);
        bVar168 = (byte)uVar32;
        bVar169 = (byte)((uint)uVar32 >> 8);
        bVar170 = (byte)((uint)uVar32 >> 0x10);
        bVar171 = (byte)((uint)uVar32 >> 0x18);
        bVar172 = (byte)uVar31;
        bVar173 = (byte)((uint)uVar31 >> 8);
        bVar174 = (byte)((uint)uVar31 >> 0x10);
        bVar175 = (byte)((uint)uVar31 >> 0x18);
        bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                        ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                        ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                        ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                        ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        piVar50 = coeff_contexts + lVar47 * 4;
        *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar51;
        piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar53;
        piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar55;
        piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar56;
        piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar57;
        piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar58;
        piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar59;
        piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar60;
        piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar61;
        piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar63;
        piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x15;
        piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x15;
        piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar65;
        piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x15;
        piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x15;
        piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x15;
        lVar47 = lVar47 + 4;
        cVar51 = '\x15';
        cVar53 = '\x15';
        cVar55 = '\x15';
        cVar56 = '\x15';
        cVar57 = '\x15';
        cVar58 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar61 = '\x15';
        cVar63 = '\x15';
        cVar65 = '\x15';
      } while (iVar14 != (int)lVar47);
    }
    else {
      cVar53 = '\x15';
      if (iVar41 == iVar40) {
        cVar70 = '\x06';
        cVar51 = '\x06';
        cVar68 = '\x01';
        cVar69 = '\x06';
        cVar58 = '\x06';
        cVar57 = '\x06';
        cVar56 = '\x15';
        cVar55 = cVar53;
        cVar59 = '\0';
        cVar60 = '\x01';
        cVar61 = cVar53;
        cVar63 = '\x15';
        cVar65 = '\x15';
        cVar67 = '\x15';
        cVar52 = '\x15';
        cVar54 = '\x15';
        cVar62 = '\x15';
        cVar64 = '\x15';
        cVar66 = '\x15';
        cVar80 = '\x15';
        cVar82 = '\x15';
        cVar84 = '\x15';
        cVar86 = '\x15';
        cVar88 = '\x15';
        cVar90 = '\x15';
        cVar92 = '\x15';
      }
      else {
        cVar57 = '\v';
        cVar58 = '\v';
        cVar55 = cVar57;
        cVar56 = cVar58;
        if (iVar40 <= iVar41) {
          cVar56 = '\x15';
          cVar57 = '\x06';
          cVar58 = '\x06';
          cVar55 = '\x15';
        }
        cVar68 = '\x10';
        cVar69 = '\x10';
        cVar70 = '\x10';
        cVar51 = '\x10';
        cVar52 = '\x10';
        cVar54 = '\x10';
        cVar62 = '\x10';
        cVar64 = '\x10';
        cVar66 = '\x10';
        cVar80 = '\x10';
        cVar82 = '\x10';
        cVar84 = '\x10';
        cVar86 = '\x10';
        cVar88 = '\x10';
        cVar90 = '\x10';
        cVar92 = '\x10';
        cVar59 = cVar68;
        cVar60 = cVar69;
        cVar61 = cVar68;
        cVar63 = cVar69;
        cVar65 = cVar70;
        cVar67 = cVar51;
        if (iVar41 < iVar40) {
          cVar68 = '\v';
          cVar69 = '\v';
          cVar70 = '\x06';
          cVar51 = '\x06';
          cVar59 = '\0';
          cVar60 = '\v';
          cVar61 = '\x15';
          cVar63 = '\x15';
          cVar65 = '\x15';
          cVar67 = '\x15';
          cVar52 = '\x15';
          cVar54 = '\x15';
          cVar62 = '\x15';
          cVar64 = '\x15';
          cVar66 = '\x15';
          cVar80 = '\x15';
          cVar82 = '\x15';
          cVar84 = '\x15';
          cVar86 = '\x15';
          cVar88 = '\x15';
          cVar90 = '\x15';
          cVar92 = '\x15';
        }
      }
      piVar50 = coeff_contexts;
      iVar41 = iVar14;
      cVar96 = cVar61;
      cVar98 = cVar63;
      cVar100 = cVar65;
      cVar102 = cVar57;
      cVar104 = cVar67;
      cVar94 = cVar70;
      cVar106 = cVar52;
      cVar108 = cVar54;
      cVar110 = cVar62;
      cVar71 = cVar64;
      cVar72 = cVar66;
      cVar73 = cVar80;
      cVar74 = cVar82;
      cVar75 = cVar84;
      cVar76 = cVar86;
      cVar77 = cVar88;
      cVar78 = cVar90;
      cVar79 = cVar92;
      do {
        cVar111 = cVar92;
        cVar109 = cVar90;
        cVar107 = cVar88;
        cVar105 = cVar86;
        cVar103 = cVar84;
        cVar101 = cVar82;
        cVar99 = cVar80;
        cVar97 = cVar66;
        cVar95 = cVar64;
        cVar93 = cVar62;
        cVar91 = cVar54;
        cVar89 = cVar52;
        cVar87 = cVar104;
        cVar85 = cVar70;
        cVar83 = cVar69;
        cVar81 = cVar68;
        cVar69 = cVar58;
        cVar68 = cVar102;
        cVar102 = cVar57;
        lVar47 = 0;
        do {
          lVar46 = lVar47;
          pbVar1 = levels + lVar46 + iVar45;
          bVar176 = *pbVar1;
          bVar177 = pbVar1[1];
          bVar178 = pbVar1[2];
          bVar179 = pbVar1[3];
          bVar180 = pbVar1[4];
          bVar181 = pbVar1[5];
          bVar182 = pbVar1[6];
          bVar183 = pbVar1[7];
          bVar184 = pbVar1[8];
          bVar185 = pbVar1[9];
          bVar186 = pbVar1[10];
          bVar187 = pbVar1[0xb];
          bVar188 = pbVar1[0xc];
          bVar189 = pbVar1[0xd];
          bVar190 = pbVar1[0xe];
          bVar191 = pbVar1[0xf];
          pbVar1 = levels + lVar46 + 1;
          bVar112 = *pbVar1;
          bVar113 = pbVar1[1];
          bVar114 = pbVar1[2];
          bVar115 = pbVar1[3];
          bVar116 = pbVar1[4];
          bVar117 = pbVar1[5];
          bVar118 = pbVar1[6];
          bVar119 = pbVar1[7];
          bVar120 = pbVar1[8];
          bVar121 = pbVar1[9];
          bVar122 = pbVar1[10];
          bVar123 = pbVar1[0xb];
          bVar124 = pbVar1[0xc];
          bVar125 = pbVar1[0xd];
          bVar126 = pbVar1[0xe];
          bVar127 = pbVar1[0xf];
          pbVar1 = levels + lVar46 + 2;
          bVar128 = *pbVar1;
          bVar129 = pbVar1[1];
          bVar130 = pbVar1[2];
          bVar131 = pbVar1[3];
          bVar132 = pbVar1[4];
          bVar133 = pbVar1[5];
          bVar134 = pbVar1[6];
          bVar135 = pbVar1[7];
          bVar136 = pbVar1[8];
          bVar137 = pbVar1[9];
          bVar138 = pbVar1[10];
          bVar139 = pbVar1[0xb];
          bVar140 = pbVar1[0xc];
          bVar141 = pbVar1[0xd];
          bVar142 = pbVar1[0xe];
          bVar143 = pbVar1[0xf];
          pbVar1 = levels + lVar46 + lVar37;
          bVar144 = *pbVar1;
          bVar145 = pbVar1[1];
          bVar146 = pbVar1[2];
          bVar147 = pbVar1[3];
          bVar148 = pbVar1[4];
          bVar149 = pbVar1[5];
          bVar150 = pbVar1[6];
          bVar151 = pbVar1[7];
          bVar152 = pbVar1[8];
          bVar153 = pbVar1[9];
          bVar154 = pbVar1[10];
          bVar155 = pbVar1[0xb];
          bVar156 = pbVar1[0xc];
          bVar157 = pbVar1[0xd];
          bVar158 = pbVar1[0xe];
          bVar159 = pbVar1[0xf];
          pbVar1 = levels + lVar46 + lVar43;
          bVar160 = *pbVar1;
          bVar161 = pbVar1[1];
          bVar162 = pbVar1[2];
          bVar163 = pbVar1[3];
          bVar164 = pbVar1[4];
          bVar165 = pbVar1[5];
          bVar166 = pbVar1[6];
          bVar167 = pbVar1[7];
          bVar168 = pbVar1[8];
          bVar169 = pbVar1[9];
          bVar170 = pbVar1[10];
          bVar171 = pbVar1[0xb];
          bVar172 = pbVar1[0xc];
          bVar173 = pbVar1[0xd];
          bVar174 = pbVar1[0xe];
          bVar175 = pbVar1[0xf];
          bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                          ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                          ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                          ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                          ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112),0);
          bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                          ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                          ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                          ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177) +
                          ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113),0);
          bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                          ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                          ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                          ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178) +
                          ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114),0);
          bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                          ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                          ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                          ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179) +
                          ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115),0);
          bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                          ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                          ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                          ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180) +
                          ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116),0);
          bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                          ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                          ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                          ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181) +
                          ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117),0);
          bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                          ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                          ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                          ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182) +
                          ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118),0);
          bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                          ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                          ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                          ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183) +
                          ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119),0);
          bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                          ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                          ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                          ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184) +
                          ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120),0);
          bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                          ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                          ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                          ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185) +
                          ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121),0);
          bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                          ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                          ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                          ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186) +
                          ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122),0);
          bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                          ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                          ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                          ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187) +
                          ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123),0);
          bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                          ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                          ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                          ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188) +
                          ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124),0);
          bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                          ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                          ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                          ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189) +
                          ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125),0);
          bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                          ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                          ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                          ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190) +
                          ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126),0);
          bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                          ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                          ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                          ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191) +
                          ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127),0);
          piVar2 = piVar50 + lVar46;
          *piVar2 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar59;
          piVar2[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar60;
          piVar2[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar94;
          piVar2[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar51;
          piVar2[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar106;
          piVar2[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar108;
          piVar2[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar110;
          piVar2[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar71;
          piVar2[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar72;
          piVar2[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar73;
          piVar2[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar74;
          piVar2[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar75;
          piVar2[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar76;
          piVar2[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar77;
          piVar2[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar78;
          piVar2[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar79;
          lVar47 = lVar46 + 0x10;
          cVar59 = cVar61;
          cVar60 = cVar63;
          cVar94 = cVar65;
          cVar51 = cVar67;
        } while (iVar44 != (int)lVar47);
        levels = levels + lVar46 + 0x14;
        piVar50 = piVar50 + lVar47;
        iVar41 = iVar41 + -1;
        cVar61 = cVar96;
        cVar63 = cVar98;
        cVar65 = cVar100;
        cVar67 = cVar87;
        cVar96 = cVar53;
        cVar98 = '\x15';
        cVar100 = '\x15';
        cVar57 = cVar55;
        cVar58 = cVar56;
        cVar70 = '\x15';
        cVar104 = '\x15';
        cVar52 = '\x15';
        cVar54 = '\x15';
        cVar62 = '\x15';
        cVar64 = '\x15';
        cVar66 = '\x15';
        cVar80 = '\x15';
        cVar82 = '\x15';
        cVar84 = '\x15';
        cVar86 = '\x15';
        cVar88 = '\x15';
        cVar90 = '\x15';
        cVar92 = '\x15';
        cVar59 = cVar81;
        cVar60 = cVar83;
        cVar94 = cVar85;
        cVar51 = cVar87;
        cVar106 = cVar89;
        cVar108 = cVar91;
        cVar110 = cVar93;
        cVar71 = cVar95;
        cVar72 = cVar97;
        cVar73 = cVar99;
        cVar74 = cVar101;
        cVar75 = cVar103;
        cVar76 = cVar105;
        cVar77 = cVar107;
        cVar78 = cVar109;
        cVar79 = cVar111;
      } while (iVar41 != 0);
    }
    *coeff_contexts = '\0';
  }
  else if (iVar44 == 4) {
    lVar37 = 0;
    do {
      uVar15 = *(undefined4 *)(levels + lVar37 * 8 + 0x19);
      uVar16 = *(undefined4 *)(levels + lVar37 * 8 + 0x11);
      uVar17 = *(undefined4 *)(levels + lVar37 * 8 + 9);
      uVar18 = *(undefined4 *)(levels + lVar37 * 8 + 1);
      uVar19 = *(undefined4 *)(levels + lVar37 * 8 + 0x20);
      uVar20 = *(undefined4 *)(levels + lVar37 * 8 + 0x18);
      uVar21 = *(undefined4 *)(levels + lVar37 * 8 + 0x10);
      uVar22 = *(undefined4 *)(levels + lVar37 * 8 + 8);
      uVar23 = *(undefined4 *)(levels + lVar37 * 8 + 0x1a);
      uVar24 = *(undefined4 *)(levels + lVar37 * 8 + 0x12);
      uVar25 = *(undefined4 *)(levels + lVar37 * 8 + 10);
      uVar26 = *(undefined4 *)(levels + lVar37 * 8 + 2);
      uVar27 = *(undefined4 *)(levels + lVar37 * 8 + 0x1b);
      uVar28 = *(undefined4 *)(levels + lVar37 * 8 + 0x13);
      uVar29 = *(undefined4 *)(levels + lVar37 * 8 + 0xb);
      uVar30 = *(undefined4 *)(levels + lVar37 * 8 + 3);
      uVar31 = *(undefined4 *)(levels + lVar37 * 8 + 0x1c);
      uVar32 = *(undefined4 *)(levels + lVar37 * 8 + 0x14);
      uVar33 = *(undefined4 *)(levels + lVar37 * 8 + 0xc);
      uVar34 = *(undefined4 *)(levels + lVar37 * 8 + 4);
      bVar176 = (byte)uVar18;
      bVar177 = (byte)((uint)uVar18 >> 8);
      bVar178 = (byte)((uint)uVar18 >> 0x10);
      bVar179 = (byte)((uint)uVar18 >> 0x18);
      bVar180 = (byte)uVar17;
      bVar181 = (byte)((uint)uVar17 >> 8);
      bVar182 = (byte)((uint)uVar17 >> 0x10);
      bVar183 = (byte)((uint)uVar17 >> 0x18);
      bVar184 = (byte)uVar16;
      bVar185 = (byte)((uint)uVar16 >> 8);
      bVar186 = (byte)((uint)uVar16 >> 0x10);
      bVar187 = (byte)((uint)uVar16 >> 0x18);
      bVar188 = (byte)uVar15;
      bVar189 = (byte)((uint)uVar15 >> 8);
      bVar190 = (byte)((uint)uVar15 >> 0x10);
      bVar191 = (byte)((uint)uVar15 >> 0x18);
      bVar112 = (byte)uVar22;
      bVar113 = (byte)((uint)uVar22 >> 8);
      bVar114 = (byte)((uint)uVar22 >> 0x10);
      bVar115 = (byte)((uint)uVar22 >> 0x18);
      bVar116 = (byte)uVar21;
      bVar117 = (byte)((uint)uVar21 >> 8);
      bVar118 = (byte)((uint)uVar21 >> 0x10);
      bVar119 = (byte)((uint)uVar21 >> 0x18);
      bVar120 = (byte)uVar20;
      bVar121 = (byte)((uint)uVar20 >> 8);
      bVar122 = (byte)((uint)uVar20 >> 0x10);
      bVar123 = (byte)((uint)uVar20 >> 0x18);
      bVar124 = (byte)uVar19;
      bVar125 = (byte)((uint)uVar19 >> 8);
      bVar126 = (byte)((uint)uVar19 >> 0x10);
      bVar127 = (byte)((uint)uVar19 >> 0x18);
      bVar128 = (byte)uVar26;
      bVar129 = (byte)((uint)uVar26 >> 8);
      bVar130 = (byte)((uint)uVar26 >> 0x10);
      bVar131 = (byte)((uint)uVar26 >> 0x18);
      bVar132 = (byte)uVar25;
      bVar133 = (byte)((uint)uVar25 >> 8);
      bVar134 = (byte)((uint)uVar25 >> 0x10);
      bVar135 = (byte)((uint)uVar25 >> 0x18);
      bVar136 = (byte)uVar24;
      bVar137 = (byte)((uint)uVar24 >> 8);
      bVar138 = (byte)((uint)uVar24 >> 0x10);
      bVar139 = (byte)((uint)uVar24 >> 0x18);
      bVar140 = (byte)uVar23;
      bVar141 = (byte)((uint)uVar23 >> 8);
      bVar142 = (byte)((uint)uVar23 >> 0x10);
      bVar143 = (byte)((uint)uVar23 >> 0x18);
      bVar144 = (byte)uVar30;
      bVar145 = (byte)((uint)uVar30 >> 8);
      bVar146 = (byte)((uint)uVar30 >> 0x10);
      bVar147 = (byte)((uint)uVar30 >> 0x18);
      bVar148 = (byte)uVar29;
      bVar149 = (byte)((uint)uVar29 >> 8);
      bVar150 = (byte)((uint)uVar29 >> 0x10);
      bVar151 = (byte)((uint)uVar29 >> 0x18);
      bVar152 = (byte)uVar28;
      bVar153 = (byte)((uint)uVar28 >> 8);
      bVar154 = (byte)((uint)uVar28 >> 0x10);
      bVar155 = (byte)((uint)uVar28 >> 0x18);
      bVar156 = (byte)uVar27;
      bVar157 = (byte)((uint)uVar27 >> 8);
      bVar158 = (byte)((uint)uVar27 >> 0x10);
      bVar159 = (byte)((uint)uVar27 >> 0x18);
      bVar160 = (byte)uVar34;
      bVar161 = (byte)((uint)uVar34 >> 8);
      bVar162 = (byte)((uint)uVar34 >> 0x10);
      bVar163 = (byte)((uint)uVar34 >> 0x18);
      bVar164 = (byte)uVar33;
      bVar165 = (byte)((uint)uVar33 >> 8);
      bVar166 = (byte)((uint)uVar33 >> 0x10);
      bVar167 = (byte)((uint)uVar33 >> 0x18);
      bVar168 = (byte)uVar32;
      bVar169 = (byte)((uint)uVar32 >> 8);
      bVar170 = (byte)((uint)uVar32 >> 0x10);
      bVar171 = (byte)((uint)uVar32 >> 0x18);
      bVar172 = (byte)uVar31;
      bVar173 = (byte)((uint)uVar31 >> 8);
      bVar174 = (byte)((uint)uVar31 >> 0x10);
      bVar175 = (byte)((uint)uVar31 >> 0x18);
      bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                      ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                      ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                      ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                      ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
      bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                      ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                      ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                      ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                      ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
      bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                      ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                      ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                      ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                      ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
      bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                      ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                      ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                      ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                      ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
      bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                      ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                      ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                      ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                      ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
      bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                      ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                      ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                      ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                      ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
      bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                      ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                      ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                      ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                      ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
      bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                      ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                      ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                      ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                      ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
      bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                      ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                      ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                      ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                      ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
      bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                      ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                      ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                      ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                      ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
      bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                      ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                      ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                      ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                      ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
      bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                      ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                      ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                      ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                      ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
      bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                      ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                      ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                      ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                      ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
      bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                      ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                      ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                      ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                      ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
      bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                      ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                      ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                      ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                      ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
      bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                      ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                      ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                      ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                      ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
      piVar50 = coeff_contexts + lVar37 * 4;
      *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + 0x1a;
      piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + 0x1f;
      piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + 0x24;
      piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + 0x24;
      piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + 0x1a;
      piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + 0x1f;
      piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + 0x24;
      piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + 0x24;
      piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + 0x1a;
      piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x1f;
      piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x24;
      piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
      piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x1a;
      piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x1f;
      piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x24;
      piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
      lVar37 = lVar37 + 4;
    } while (iVar14 != (int)lVar37);
  }
  else if (iVar44 == 8) {
    puVar42 = levels + 1;
    lVar37 = 0;
    do {
      uVar3 = *(undefined8 *)puVar42;
      uVar4 = *(undefined8 *)(puVar42 + 0xc);
      uVar5 = *(undefined8 *)(puVar42 + 0xb);
      uVar6 = *(undefined8 *)(puVar42 + 0x17);
      uVar7 = *(undefined8 *)(puVar42 + 1);
      uVar8 = *(undefined8 *)(puVar42 + 0xd);
      uVar9 = *(undefined8 *)(puVar42 + 2);
      uVar10 = *(undefined8 *)(puVar42 + 0xe);
      uVar11 = *(undefined8 *)(puVar42 + 3);
      uVar12 = *(undefined8 *)(puVar42 + 0xf);
      bVar176 = (byte)uVar3;
      bVar177 = (byte)((ulong)uVar3 >> 8);
      bVar178 = (byte)((ulong)uVar3 >> 0x10);
      bVar179 = (byte)((ulong)uVar3 >> 0x18);
      bVar180 = (byte)((ulong)uVar3 >> 0x20);
      bVar181 = (byte)((ulong)uVar3 >> 0x28);
      bVar182 = (byte)((ulong)uVar3 >> 0x30);
      bVar183 = (byte)((ulong)uVar3 >> 0x38);
      bVar184 = (byte)uVar4;
      bVar185 = (byte)((ulong)uVar4 >> 8);
      bVar186 = (byte)((ulong)uVar4 >> 0x10);
      bVar187 = (byte)((ulong)uVar4 >> 0x18);
      bVar188 = (byte)((ulong)uVar4 >> 0x20);
      bVar189 = (byte)((ulong)uVar4 >> 0x28);
      bVar190 = (byte)((ulong)uVar4 >> 0x30);
      bVar191 = (byte)((ulong)uVar4 >> 0x38);
      bVar112 = (byte)uVar5;
      bVar113 = (byte)((ulong)uVar5 >> 8);
      bVar114 = (byte)((ulong)uVar5 >> 0x10);
      bVar115 = (byte)((ulong)uVar5 >> 0x18);
      bVar116 = (byte)((ulong)uVar5 >> 0x20);
      bVar117 = (byte)((ulong)uVar5 >> 0x28);
      bVar118 = (byte)((ulong)uVar5 >> 0x30);
      bVar119 = (byte)((ulong)uVar5 >> 0x38);
      bVar120 = (byte)uVar6;
      bVar121 = (byte)((ulong)uVar6 >> 8);
      bVar122 = (byte)((ulong)uVar6 >> 0x10);
      bVar123 = (byte)((ulong)uVar6 >> 0x18);
      bVar124 = (byte)((ulong)uVar6 >> 0x20);
      bVar125 = (byte)((ulong)uVar6 >> 0x28);
      bVar126 = (byte)((ulong)uVar6 >> 0x30);
      bVar127 = (byte)((ulong)uVar6 >> 0x38);
      bVar128 = (byte)uVar7;
      bVar129 = (byte)((ulong)uVar7 >> 8);
      bVar130 = (byte)((ulong)uVar7 >> 0x10);
      bVar131 = (byte)((ulong)uVar7 >> 0x18);
      bVar132 = (byte)((ulong)uVar7 >> 0x20);
      bVar133 = (byte)((ulong)uVar7 >> 0x28);
      bVar134 = (byte)((ulong)uVar7 >> 0x30);
      bVar135 = (byte)((ulong)uVar7 >> 0x38);
      bVar136 = (byte)uVar8;
      bVar137 = (byte)((ulong)uVar8 >> 8);
      bVar138 = (byte)((ulong)uVar8 >> 0x10);
      bVar139 = (byte)((ulong)uVar8 >> 0x18);
      bVar140 = (byte)((ulong)uVar8 >> 0x20);
      bVar141 = (byte)((ulong)uVar8 >> 0x28);
      bVar142 = (byte)((ulong)uVar8 >> 0x30);
      bVar143 = (byte)((ulong)uVar8 >> 0x38);
      bVar144 = (byte)uVar9;
      bVar145 = (byte)((ulong)uVar9 >> 8);
      bVar146 = (byte)((ulong)uVar9 >> 0x10);
      bVar147 = (byte)((ulong)uVar9 >> 0x18);
      bVar148 = (byte)((ulong)uVar9 >> 0x20);
      bVar149 = (byte)((ulong)uVar9 >> 0x28);
      bVar150 = (byte)((ulong)uVar9 >> 0x30);
      bVar151 = (byte)((ulong)uVar9 >> 0x38);
      bVar152 = (byte)uVar10;
      bVar153 = (byte)((ulong)uVar10 >> 8);
      bVar154 = (byte)((ulong)uVar10 >> 0x10);
      bVar155 = (byte)((ulong)uVar10 >> 0x18);
      bVar156 = (byte)((ulong)uVar10 >> 0x20);
      bVar157 = (byte)((ulong)uVar10 >> 0x28);
      bVar158 = (byte)((ulong)uVar10 >> 0x30);
      bVar159 = (byte)((ulong)uVar10 >> 0x38);
      bVar160 = (byte)uVar11;
      bVar161 = (byte)((ulong)uVar11 >> 8);
      bVar162 = (byte)((ulong)uVar11 >> 0x10);
      bVar163 = (byte)((ulong)uVar11 >> 0x18);
      bVar164 = (byte)((ulong)uVar11 >> 0x20);
      bVar165 = (byte)((ulong)uVar11 >> 0x28);
      bVar166 = (byte)((ulong)uVar11 >> 0x30);
      bVar167 = (byte)((ulong)uVar11 >> 0x38);
      bVar168 = (byte)uVar12;
      bVar169 = (byte)((ulong)uVar12 >> 8);
      bVar170 = (byte)((ulong)uVar12 >> 0x10);
      bVar171 = (byte)((ulong)uVar12 >> 0x18);
      bVar172 = (byte)((ulong)uVar12 >> 0x20);
      bVar173 = (byte)((ulong)uVar12 >> 0x28);
      bVar174 = (byte)((ulong)uVar12 >> 0x30);
      bVar175 = (byte)((ulong)uVar12 >> 0x38);
      bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                      ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                      ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                      ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                      ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176),0);
      bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                      ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                      ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                      ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                      ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
      bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                      ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                      ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                      ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                      ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
      bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                      ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                      ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                      ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                      ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
      bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                      ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                      ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                      ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                      ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
      bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                      ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                      ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                      ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                      ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
      bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                      ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                      ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                      ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                      ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
      bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                      ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                      ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                      ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                      ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
      bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                      ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                      ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                      ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                      ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
      bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                      ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                      ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                      ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                      ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
      bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                      ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                      ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                      ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122) +
                      ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
      bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                      ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                      ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                      ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                      ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
      bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                      ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                      ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                      ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124) +
                      ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
      bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                      ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                      ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                      ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                      ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
      bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                      ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                      ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                      ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126) +
                      ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
      bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                      ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                      ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                      ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                      ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
      piVar50 = coeff_contexts + lVar37 * 8;
      *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + 0x1a;
      piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + 0x1f;
      piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + 0x24;
      piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + 0x24;
      piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + 0x24;
      piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + 0x24;
      piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + 0x24;
      piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + 0x24;
      piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + 0x1a;
      piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x1f;
      piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x24;
      piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
      piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x24;
      piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x24;
      piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x24;
      piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
      lVar37 = lVar37 + 2;
      puVar42 = puVar42 + 0x18;
    } while (iVar14 != (int)lVar37);
  }
  else {
    piVar50 = coeff_contexts;
    iVar41 = iVar14;
    do {
      levels = levels + 4;
      iVar40 = iVar44;
      cVar53 = '\x1a';
      cVar55 = '\x1f';
      do {
        pbVar1 = levels + (long)iVar45 + -4;
        bVar176 = *pbVar1;
        bVar177 = pbVar1[1];
        bVar178 = pbVar1[2];
        bVar179 = pbVar1[3];
        bVar180 = pbVar1[4];
        bVar181 = pbVar1[5];
        bVar182 = pbVar1[6];
        bVar183 = pbVar1[7];
        bVar184 = pbVar1[8];
        bVar185 = pbVar1[9];
        bVar186 = pbVar1[10];
        bVar187 = pbVar1[0xb];
        bVar188 = pbVar1[0xc];
        bVar189 = pbVar1[0xd];
        bVar190 = pbVar1[0xe];
        bVar191 = pbVar1[0xf];
        bVar112 = levels[-3];
        bVar113 = levels[-2];
        bVar114 = levels[-1];
        bVar115 = *levels;
        bVar116 = levels[1];
        bVar117 = levels[2];
        bVar118 = levels[3];
        bVar119 = levels[4];
        bVar120 = levels[5];
        bVar121 = levels[6];
        bVar122 = levels[7];
        bVar123 = levels[8];
        bVar124 = levels[9];
        bVar125 = levels[10];
        bVar126 = levels[0xb];
        bVar127 = levels[0xc];
        bVar128 = levels[-2];
        bVar129 = levels[-1];
        bVar130 = *levels;
        bVar131 = levels[1];
        bVar132 = levels[2];
        bVar133 = levels[3];
        bVar134 = levels[4];
        bVar135 = levels[5];
        bVar136 = levels[6];
        bVar137 = levels[7];
        bVar138 = levels[8];
        bVar139 = levels[9];
        bVar140 = levels[10];
        bVar141 = levels[0xb];
        bVar142 = levels[0xc];
        bVar143 = levels[0xd];
        bVar144 = levels[-1];
        bVar145 = *levels;
        bVar146 = levels[1];
        bVar147 = levels[2];
        bVar148 = levels[3];
        bVar149 = levels[4];
        bVar150 = levels[5];
        bVar151 = levels[6];
        bVar152 = levels[7];
        bVar153 = levels[8];
        bVar154 = levels[9];
        bVar155 = levels[10];
        bVar156 = levels[0xb];
        bVar157 = levels[0xc];
        bVar158 = levels[0xd];
        bVar159 = levels[0xe];
        bVar160 = *levels;
        bVar161 = levels[1];
        bVar162 = levels[2];
        bVar163 = levels[3];
        bVar164 = levels[4];
        bVar165 = levels[5];
        bVar166 = levels[6];
        bVar167 = levels[7];
        bVar168 = levels[8];
        bVar169 = levels[9];
        bVar170 = levels[10];
        bVar171 = levels[0xb];
        bVar172 = levels[0xc];
        bVar173 = levels[0xd];
        bVar174 = levels[0xe];
        bVar175 = levels[0xf];
        bVar176 = pavgb(((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar144) * '\x03' | (3 >= bVar144) * bVar144) +
                        ((3 < bVar128) * '\x03' | (3 >= bVar128) * bVar128) +
                        ((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112),0);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar130) * '\x03' | (3 >= bVar130) * bVar130) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar132) * '\x03' | (3 >= bVar132) * bVar132) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar134) * '\x03' | (3 >= bVar134) * bVar134) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar136) * '\x03' | (3 >= bVar136) * bVar136) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar138) * '\x03' | (3 >= bVar138) * bVar138) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186) +
                        ((3 < bVar122) * '\x03' | (3 >= bVar122) * bVar122),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar140) * '\x03' | (3 >= bVar140) * bVar140) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188) +
                        ((3 < bVar124) * '\x03' | (3 >= bVar124) * bVar124),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar142) * '\x03' | (3 >= bVar142) * bVar142) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190) +
                        ((3 < bVar126) * '\x03' | (3 >= bVar126) * bVar126),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127),0);
        *piVar50 = ((4 < bVar176) * '\x04' | (4 >= bVar176) * bVar176) + cVar53;
        piVar50[1] = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar55;
        piVar50[2] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + 0x24;
        piVar50[3] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + 0x24;
        piVar50[4] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + 0x24;
        piVar50[5] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + 0x24;
        piVar50[6] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + 0x24;
        piVar50[7] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + 0x24;
        piVar50[8] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + 0x24;
        piVar50[9] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x24;
        piVar50[10] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x24;
        piVar50[0xb] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
        piVar50[0xc] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x24;
        piVar50[0xd] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x24;
        piVar50[0xe] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x24;
        piVar50[0xf] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
        piVar50 = piVar50 + 0x10;
        levels = levels + 0x10;
        iVar40 = iVar40 + -0x10;
        cVar53 = '$';
        cVar55 = '$';
      } while (iVar40 != 0);
      iVar41 = iVar41 + -1;
    } while (iVar41 != 0);
  }
  uVar39 = (uint)tx_size;
  if (uVar39 < 0x11) {
    uVar36 = 3;
    if ((uVar39 - 0xb < 2) || (uVar39 == 4)) goto LAB_002564c0;
  }
  else {
    if (uVar39 == 0x11) {
      uVar36 = 9;
      goto LAB_002564c0;
    }
    if (uVar39 == 0x12) {
      uVar36 = 10;
      goto LAB_002564c0;
    }
  }
  uVar36 = uVar48;
LAB_002564c0:
  bVar176 = *(byte *)(tx_size_high_log2 + uVar36) & 0x1f;
  iVar44 = iVar14 << bVar176;
  sVar13 = scan[iVar38];
  iVar45 = iVar44 + 7;
  if (-1 < iVar14 << bVar176) {
    iVar45 = iVar44;
  }
  if (iVar38 <= iVar45 >> 3) {
    coeff_contexts[sVar13] = '\x01';
    return;
  }
  iVar45 = iVar44 + 3;
  if (-1 < iVar14 << bVar176) {
    iVar45 = iVar44;
  }
  if (iVar45 >> 2 < iVar38) {
    coeff_contexts[sVar13] = '\x03';
    return;
  }
  coeff_contexts[sVar13] = '\x02';
  return;
}

Assistant:

void av1_get_nz_map_contexts_sse2(const uint8_t *const levels,
                                  const int16_t *const scan, const uint16_t eob,
                                  const TX_SIZE tx_size,
                                  const TX_CLASS tx_class,
                                  int8_t *const coeff_contexts) {
  const int last_idx = eob - 1;
  if (!last_idx) {
    coeff_contexts[0] = 0;
    return;
  }

  const int real_width = tx_size_wide[tx_size];
  const int real_height = tx_size_high[tx_size];
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  const int stride = height + TX_PAD_HOR;
  ptrdiff_t offsets[3];

  /* coeff_contexts must be 16 byte aligned. */
  assert(!((intptr_t)coeff_contexts & 0xf));

  if (tx_class == TX_CLASS_2D) {
    offsets[0] = 0 * stride + 2;
    offsets[1] = 1 * stride + 1;
    offsets[2] = 2 * stride + 0;

    if (height == 4) {
      get_4_nz_map_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 16) {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    }
  } else if (tx_class == TX_CLASS_HORIZ) {
    offsets[0] = 2 * stride;
    offsets[1] = 3 * stride;
    offsets[2] = 4 * stride;
    if (height == 4) {
      get_4_nz_map_contexts_hor(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_hor(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_hor(levels, width, height, offsets,
                                 coeff_contexts);
    }
  } else {  // TX_CLASS_VERT
    offsets[0] = 2;
    offsets[1] = 3;
    offsets[2] = 4;
    if (height == 4) {
      get_4_nz_map_contexts_ver(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_ver(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_ver(levels, width, height, offsets,
                                 coeff_contexts);
    }
  }

  const int bhl = get_txb_bhl(tx_size);
  const int pos = scan[last_idx];
  if (last_idx <= (width << bhl) / 8)
    coeff_contexts[pos] = 1;
  else if (last_idx <= (width << bhl) / 4)
    coeff_contexts[pos] = 2;
  else
    coeff_contexts[pos] = 3;
}